

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_shutdown(void)

{
  __int_type_conflict _Var1;
  fdb_status ret;
  __int_type_conflict unaff_retaddr;
  __atomic_base<unsigned_char> *in_stack_00000008;
  fdb_status local_4;
  
  local_4 = FDB_RESULT_SUCCESS;
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_char(in_stack_00000008);
  if (_Var1 != '\0') {
    pthread_spin_lock(&initial_lock);
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_char(in_stack_00000008);
    if (_Var1 == '\0') {
      pthread_spin_unlock(&initial_lock);
      local_4 = FDB_RESULT_SUCCESS;
    }
    else if (fdb_open_inprog == 0) {
      compactor_shutdown();
      local_4 = filemgr_shutdown();
      if (local_4 == FDB_RESULT_SUCCESS) {
        std::__atomic_base<unsigned_char>::operator=(in_stack_00000008,unaff_retaddr);
        pthread_spin_unlock(&initial_lock);
      }
      else {
        pthread_spin_unlock(&initial_lock);
      }
    }
    else {
      pthread_spin_unlock(&initial_lock);
      local_4 = FDB_RESULT_FILE_IS_BUSY;
    }
  }
  return local_4;
}

Assistant:

LIBFDB_API
fdb_status fdb_shutdown()
{
    fdb_status ret = FDB_RESULT_SUCCESS;
    if (fdb_initialized) {

#ifndef SPIN_INITIALIZER
        // Windows: check if spin lock is already destroyed.
        if (InterlockedCompareExchange(&initial_lock_status, 1, 2) == 2) {
            spin_lock(&initial_lock);
        } else {
            // ForestDB is already shut down
            return ret;
        }
#else
        spin_lock(&initial_lock);
#endif

        if (!fdb_initialized) {
            // ForestDB is already shut down
            spin_unlock(&initial_lock);
            return ret;
        }
        if (fdb_open_inprog) {
            spin_unlock(&initial_lock);
            return FDB_RESULT_FILE_IS_BUSY;
        }
        compactor_shutdown();
        //bgflusher_shutdown();
        ret = filemgr_shutdown();
        if (ret == FDB_RESULT_SUCCESS) {
#ifdef _MEMPOOL
            mempool_shutdown();
#endif
            fdb_initialized = 0;
            spin_unlock(&initial_lock);
#ifndef SPIN_INITIALIZER
            spin_destroy(&initial_lock);
            initial_lock_status = 0;
#endif
        } else { // some file may be still open...
            spin_unlock(&initial_lock);
        }
        //_dbg_destroy_altstack();
    }
    return ret;
}